

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O2

void highsSparseTranspose
               (HighsInt numRow,HighsInt numCol,vector<int,_std::allocator<int>_> *Astart,
               vector<int,_std::allocator<int>_> *Aindex,
               vector<double,_std::allocator<double>_> *Avalue,
               vector<int,_std::allocator<int>_> *ARstart,vector<int,_std::allocator<int>_> *ARindex
               ,vector<double,_std::allocator<double>_> *ARvalue)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  vector<int,_std::allocator<int>_> iwork;
  allocator_type local_61;
  vector<int,_std::allocator<int>_> *local_60;
  value_type_conflict2 local_54;
  _Vector_base<int,_std::allocator<int>_> local_50;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_54 = 0;
  local_60 = ARstart;
  local_38 = Astart;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_50,(long)numRow,&local_54,&local_61);
  local_54 = 0;
  std::vector<int,_std::allocator<int>_>::resize(local_60,(long)(numRow + 1),&local_54);
  uVar11 = (ulong)((long)(Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  iVar10 = (int)uVar11;
  std::vector<int,_std::allocator<int>_>::resize(ARindex,(long)iVar10);
  std::vector<double,_std::allocator<double>_>::resize(ARvalue,(long)iVar10);
  piVar2 = (Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar8 = 0;
  uVar11 = uVar11 & 0xffffffff;
  if (iVar10 < 1) {
    uVar11 = uVar8;
  }
  for (; uVar11 != uVar8; uVar8 = uVar8 + 1) {
    local_50._M_impl.super__Vector_impl_data._M_start[piVar2[uVar8]] =
         local_50._M_impl.super__Vector_impl_data._M_start[piVar2[uVar8]] + 1;
  }
  piVar2 = (local_60->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  uVar8 = 0;
  uVar11 = (ulong)(uint)numRow;
  if (numRow < 1) {
    uVar11 = uVar8;
  }
  for (; uVar11 != uVar8; uVar8 = uVar8 + 1) {
    piVar2[uVar8 + 1] = local_50._M_impl.super__Vector_impl_data._M_start[uVar8] + piVar2[uVar8];
  }
  piVar2 = (local_60->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
    local_50._M_impl.super__Vector_impl_data._M_start[uVar8] = piVar2[uVar8];
  }
  piVar2 = (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  uVar11 = 0;
  uVar8 = (ulong)(uint)numCol;
  if (numCol < 1) {
    uVar8 = uVar11;
  }
  while (uVar7 = uVar11, uVar7 != uVar8) {
    piVar3 = (Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    piVar4 = (ARindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (Avalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (ARvalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar9 = (long)piVar2[uVar7]; uVar11 = uVar7 + 1, lVar9 < piVar2[uVar7 + 1];
        lVar9 = lVar9 + 1) {
      iVar10 = piVar3[lVar9];
      iVar1 = local_50._M_impl.super__Vector_impl_data._M_start[iVar10];
      local_50._M_impl.super__Vector_impl_data._M_start[iVar10] = iVar1 + 1;
      piVar4[iVar1] = (int)uVar7;
      pdVar6[iVar1] = pdVar5[lVar9];
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  return;
}

Assistant:

void highsSparseTranspose(HighsInt numRow, HighsInt numCol,
                          const std::vector<HighsInt>& Astart,
                          const std::vector<HighsInt>& Aindex,
                          const std::vector<double>& Avalue,
                          std::vector<HighsInt>& ARstart,
                          std::vector<HighsInt>& ARindex,
                          std::vector<double>& ARvalue) {
  // Make a AR copy
  std::vector<HighsInt> iwork(numRow, 0);
  ARstart.resize(numRow + 1, 0);
  HighsInt AcountX = Aindex.size();
  ARindex.resize(AcountX);
  ARvalue.resize(AcountX);
  for (HighsInt k = 0; k < AcountX; k++) {
    assert(Aindex[k] < numRow);
    iwork[Aindex[k]]++;
  }
  for (HighsInt i = 1; i <= numRow; i++)
    ARstart[i] = ARstart[i - 1] + iwork[i - 1];
  for (HighsInt i = 0; i < numRow; i++) iwork[i] = ARstart[i];
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
      HighsInt iRow = Aindex[k];
      HighsInt iPut = iwork[iRow]++;
      ARindex[iPut] = iCol;
      ARvalue[iPut] = Avalue[k];
    }
  }
}